

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_33808::
ARTCorrectnessTest_TwoInstances_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTCorrectnessTest_TwoInstances_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  long lVar1;
  qsbr_epoch qVar2;
  qsbr_per_thread *pqVar3;
  _Tuple_impl<0UL,_unodb::detail::dealloc_vector_list_node_*,_std::default_delete<unodb::detail::dealloc_vector_list_node>_>
  _Var4;
  _Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false> _Var5;
  qsbr *this_00;
  long **__stat_loc;
  undefined1 auVar6 [16];
  value_view v;
  thread<TypeParam>_conflict second_thread;
  __single_object new_qsbr_per_thread;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  v1;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  v2;
  _Head_base<0UL,_unodb::qsbr_per_thread_*,_false> local_920;
  __uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_> local_918;
  long *local_910;
  long local_908;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_900;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(&local_900,false);
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(&local_500,false);
  pqVar3 = (qsbr_per_thread *)operator_new(0x98);
  _Var4.super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl =
       (_Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>)operator_new(0x20);
  *(undefined8 *)
   _Var4.super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)_Var4.super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl
   + 8) = 0;
  *(undefined8 *)
   ((long)_Var4.super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl
   + 0x10) = 0;
  *(undefined8 *)
   ((long)_Var4.super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl
   + 0x18) = 0;
  (pqVar3->previous_interval_orphan_list_node)._M_t.
  super___uniq_ptr_impl<unodb::detail::dealloc_vector_list_node,_std::default_delete<unodb::detail::dealloc_vector_list_node>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::dealloc_vector_list_node_*,_std::default_delete<unodb::detail::dealloc_vector_list_node>_>
  .super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false> =
       _Var4.super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl;
  _Var5._M_head_impl = (dealloc_vector_list_node *)operator_new(0x20);
  *(undefined8 *)&(_Var5._M_head_impl)->requests = 0;
  *(pointer *)((long)&(_Var5._M_head_impl)->requests + 8) = (pointer)0x0;
  *(pointer *)((long)&(_Var5._M_head_impl)->requests + 0x10) = (pointer)0x0;
  (_Var5._M_head_impl)->next = (dealloc_vector_list_node *)0x0;
  (pqVar3->current_interval_orphan_list_node)._M_t.
  super___uniq_ptr_impl<unodb::detail::dealloc_vector_list_node,_std::default_delete<unodb::detail::dealloc_vector_list_node>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::dealloc_vector_list_node_*,_std::default_delete<unodb::detail::dealloc_vector_list_node>_>
  .super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl =
       _Var5._M_head_impl;
  pqVar3->quiescent_states_since_epoch_change = 0;
  this_00 = unodb::qsbr::instance();
  qVar2 = unodb::qsbr::register_thread(this_00);
  (pqVar3->last_seen_quiescent_state_epoch).epoch_val = qVar2.epoch_val;
  (pqVar3->last_seen_epoch).epoch_val = qVar2.epoch_val;
  pqVar3->current_interval_total_dealloc_size = 0;
  (pqVar3->previous_interval_dealloc_requests).
  super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pqVar3->previous_interval_dealloc_requests).
  super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pqVar3->previous_interval_dealloc_requests).
  super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pqVar3->current_interval_dealloc_requests).
  super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)
   ((long)&(pqVar3->previous_interval_dealloc_requests).
           super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined8 *)
   ((long)&(pqVar3->current_interval_dealloc_requests).
           super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) = 0;
  *(undefined8 *)
   ((long)&(pqVar3->current_interval_dealloc_requests).
           super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(pqVar3->current_interval_dealloc_requests).
           super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (pqVar3->active_ptrs)._M_h._M_buckets = &(pqVar3->active_ptrs)._M_h._M_single_bucket;
  (pqVar3->active_ptrs)._M_h._M_bucket_count = 1;
  auVar6 = ZEXT416(0) << 0x40;
  (pqVar3->active_ptrs)._M_h._M_before_begin = (__node_base)auVar6._0_8_;
  (pqVar3->active_ptrs)._M_h._M_element_count = auVar6._8_8_;
  (pqVar3->active_ptrs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(pqVar3->active_ptrs)._M_h._M_rehash_policy._M_next_resize = auVar6;
  local_918._M_t.
  super__Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>.
  super__Head_base<0UL,_unodb::qsbr_per_thread_*,_false>._M_head_impl =
       (tuple<unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>)
       (_Tuple_impl<0UL,_unodb::qsbr_per_thread_*,_std::default_delete<unodb::qsbr_per_thread>_>)0x0
  ;
  local_908 = 0;
  local_920._M_head_impl = pqVar3;
  local_910 = (long *)operator_new(0x18);
  *local_910 = (long)&PTR___State_impl_002ff548;
  local_910[1] = (long)&local_500;
  local_910[2] = (long)pqVar3;
  local_920._M_head_impl = (qsbr_per_thread *)0x0;
  __stat_loc = &local_910;
  std::thread::_M_start_thread(&local_908,__stat_loc,0);
  if (local_910 != (long *)0x0) {
    (**(code **)(*local_910 + 8))();
  }
  std::unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>::~unique_ptr
            ((unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_> *)
             &local_920);
  std::unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>::~unique_ptr
            ((unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_> *)
             &local_918);
  lVar1 = local_908;
  unodb::detail::thread_sync::wait((thread_sync *)unodb::detail::thread_syncs,__stat_loc);
  unodb::detail::thread_sync::notify((thread_sync *)(unodb::detail::thread_syncs + 0x60));
  v._M_extent._M_extent_value = 2;
  v._M_ptr = (pointer)&unodb::test::test_value_2;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal(&local_900,0,v,false);
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_present_values(&local_900);
  std::thread::join();
  if (lVar1 == 0) {
    if (local_500.key_views.
        super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_500.key_views.
                      super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_500.key_views.
                            super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_500.key_views.
                            super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~_Rb_tree(&local_500.values._M_t);
    unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::~olc_db
              (&local_500.test_db);
    if (local_900.key_views.
        super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_900.key_views.
                      super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_900.key_views.
                            super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_900.key_views.
                            super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~_Rb_tree(&local_900.values._M_t);
    unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::~olc_db
              (&local_900.test_db);
    return;
  }
  std::terminate();
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, TwoInstances) {
  unodb::test::tree_verifier<TypeParam> v1;
  unodb::test::tree_verifier<TypeParam> v2;

  unodb::test::thread<TypeParam> second_thread([&v2] {
    thread_syncs[0].notify();
    thread_syncs[1].wait();

    v2.insert(0, unodb::test::test_values[0]);
    v2.check_present_values();
  });

  thread_syncs[0].wait();
  thread_syncs[1].notify();

  v1.insert(0, unodb::test::test_values[1]);
  v1.check_present_values();

  second_thread.join();
}